

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverBB.cpp
# Opt level: O2

void __thiscall chrono::ChSolverBB::ArchiveIN(ChSolverBB *this,ChArchiveIn *marchive)

{
  ChNameValue<bool> local_60;
  ChNameValue<int> local_48;
  ChNameValue<int> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChSolverBB>(marchive);
  ChIterativeSolverVI::ArchiveIN(&this->super_ChIterativeSolverVI,marchive);
  local_30._value = &this->n_armijo;
  local_30._name = "n_armijo";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->max_armijo_backtrace;
  local_48._name = "max_armijo_backtrace";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  local_60._value = &(this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_use_precond;
  local_60._name = "m_use_precond";
  local_60._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_60);
  return;
}

Assistant:

void ChSolverBB::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChSolverBB>();
    // deserialize parent class
    ChIterativeSolverVI::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(n_armijo);
    marchive >> CHNVP(max_armijo_backtrace);
    marchive >> CHNVP(m_use_precond);
}